

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_util_tracemc(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  uint uVar3;
  int iVar4;
  GCstr *pGVar5;
  long lVar6;
  
  uVar3 = lj_lib_checkint(L,1);
  iVar4 = 0;
  if ((uVar3 == 0) || (uVar1 = (L->glref).ptr64, *(uint *)(uVar1 + 0x46c) <= uVar3)) {
    lVar6 = 0;
  }
  else {
    lVar6 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar3 * 8);
  }
  if ((lVar6 != 0) && (*(char **)(lVar6 + 0x58) != (char *)0x0)) {
    pTVar2 = L->top;
    pGVar5 = lj_str_new(L,*(char **)(lVar6 + 0x58),(ulong)*(uint *)(lVar6 + 0x54));
    pTVar2[-1].u64 = (ulong)pGVar5 | 0xfffd800000000000;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)*(long *)(lVar6 + 0x58);
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)*(int *)(lVar6 + 0x60);
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}